

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O0

int ixmlDocument_createAttributeEx(IXML_Document_conflict *doc,char *name,IXML_Attr **rtAttr)

{
  char *pcVar1;
  int local_2c;
  IXML_Attr *pIStack_28;
  int errCode;
  IXML_Attr *attrNode;
  IXML_Attr **rtAttr_local;
  char *name_local;
  IXML_Document_conflict *doc_local;
  
  local_2c = 0;
  pIStack_28 = (IXML_Attr *)malloc(0x80);
  if (pIStack_28 == (IXML_Attr *)0x0) {
    local_2c = 0x66;
  }
  else if ((doc == (IXML_Document_conflict *)0x0) || (name == (char *)0x0)) {
    ixmlAttr_free(pIStack_28);
    pIStack_28 = (IXML_Attr *)0x0;
    local_2c = 0x69;
  }
  else {
    ixmlAttr_init(pIStack_28);
    (pIStack_28->n).nodeType = eATTRIBUTE_NODE;
    pcVar1 = strdup(name);
    (pIStack_28->n).nodeName = pcVar1;
    if ((pIStack_28->n).nodeName == (char *)0x0) {
      ixmlAttr_free(pIStack_28);
      pIStack_28 = (IXML_Attr *)0x0;
      local_2c = 0x66;
    }
    else {
      (pIStack_28->n).ownerDocument = doc;
    }
  }
  *rtAttr = pIStack_28;
  return local_2c;
}

Assistant:

int ixmlDocument_createAttributeEx(
	IXML_Document *doc, const DOMString name, IXML_Attr **rtAttr)
{
	IXML_Attr *attrNode = NULL;
	int errCode = IXML_SUCCESS;

	attrNode = (IXML_Attr *)malloc(sizeof(IXML_Attr));
	if (attrNode == NULL) {
		errCode = IXML_INSUFFICIENT_MEMORY;
		goto ErrorHandler;
	}

	if (doc == NULL || name == NULL) {
		ixmlAttr_free(attrNode);
		attrNode = NULL;
		errCode = IXML_INVALID_PARAMETER;
		goto ErrorHandler;
	}

	ixmlAttr_init(attrNode);
	attrNode->n.nodeType = eATTRIBUTE_NODE;

	/* set the node fields */
	attrNode->n.nodeName = strdup(name);
	if (attrNode->n.nodeName == NULL) {
		ixmlAttr_free(attrNode);
		attrNode = NULL;
		errCode = IXML_INSUFFICIENT_MEMORY;
		goto ErrorHandler;
	}

	attrNode->n.ownerDocument = doc;

ErrorHandler:
	*rtAttr = attrNode;
	return errCode;
}